

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O2

ObjPipeline * rw::wdgl::makeSkinPipeline(void)

{
  ObjPipeline *pOVar1;
  
  pOVar1 = ObjPipeline::create();
  (pOVar1->super_ObjPipeline).super_Pipeline.pluginID = 0x116;
  (pOVar1->super_ObjPipeline).super_Pipeline.pluginData = 1;
  pOVar1->numCustomAttribs = 2;
  pOVar1->instanceCB = skinInstanceCB;
  pOVar1->uninstanceCB = skinUninstanceCB;
  return pOVar1;
}

Assistant:

ObjPipeline*
makeSkinPipeline(void)
{
	ObjPipeline *pipe = ObjPipeline::create();
	pipe->pluginID = ID_SKIN;
	pipe->pluginData = 1;
	pipe->numCustomAttribs = 2;
	pipe->instanceCB = skinInstanceCB;
	pipe->uninstanceCB = skinUninstanceCB;
	return pipe;
}